

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O3

void __thiscall BigInt::operator/=(BigInt *this,longlong *num)

{
  BigInt local_30;
  
  operator/(&local_30,this,*num);
  this->sign = local_30.sign;
  std::vector<long_long,_std::allocator<long_long>_>::operator=
            (&this->vector_value,&local_30.vector_value);
  if (local_30.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void operator/=(const long long &num) {
        *this = *this / num;
    }